

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void findConstInWhere(WhereConst *pConst,Expr *pExpr)

{
  int iVar1;
  CollSeq *pCVar2;
  Parse *in_RSI;
  Expr *pLeft;
  Expr *pRight;
  Vdbe *pRight_00;
  Expr *in_stack_ffffffffffffffe8;
  Expr *pLeft_00;
  
  if ((in_RSI != (Parse *)0x0) && (((ulong)in_RSI->db & 0x100000000) == 0)) {
    if (*(char *)&in_RSI->db == ',') {
      findConstInWhere((WhereConst *)in_RSI,in_stack_ffffffffffffffe8);
      findConstInWhere((WhereConst *)in_RSI,in_stack_ffffffffffffffe8);
    }
    else if (*(char *)&in_RSI->db == '5') {
      pLeft_00 = *(Expr **)&in_RSI->rc;
      pRight_00 = in_RSI->pVdbe;
      if (((pLeft_00->op == 0x9e) && ((pLeft_00->flags & 8) == 0)) &&
         (iVar1 = sqlite3ExprIsConstant((Expr *)0x1ba23f), iVar1 != 0)) {
        pCVar2 = sqlite3BinaryCompareCollSeq(in_RSI,pLeft_00,(Expr *)pRight_00);
        iVar1 = sqlite3IsBinary(pCVar2);
        if (iVar1 != 0) {
          constInsert((WhereConst *)in_RSI,pLeft_00,(Expr *)pRight_00);
          return;
        }
      }
      if (((*(u8 *)&pRight_00->db == 0x9e) && (((ulong)pRight_00->db & 0x800000000) == 0)) &&
         (iVar1 = sqlite3ExprIsConstant((Expr *)0x1ba2a7), iVar1 != 0)) {
        pCVar2 = sqlite3BinaryCompareCollSeq(in_RSI,pLeft_00,(Expr *)pRight_00);
        iVar1 = sqlite3IsBinary(pCVar2);
        if (iVar1 != 0) {
          constInsert((WhereConst *)in_RSI,pLeft_00,(Expr *)pRight_00);
        }
      }
    }
  }
  return;
}

Assistant:

static void findConstInWhere(WhereConst *pConst, Expr *pExpr){
  Expr *pRight, *pLeft;
  if( pExpr==0 ) return;
  if( ExprHasProperty(pExpr, EP_FromJoin) ) return;
  if( pExpr->op==TK_AND ){
    findConstInWhere(pConst, pExpr->pRight);
    findConstInWhere(pConst, pExpr->pLeft);
    return;
  }
  if( pExpr->op!=TK_EQ ) return;
  pRight = pExpr->pRight;
  pLeft = pExpr->pLeft;
  assert( pRight!=0 );
  assert( pLeft!=0 );
  if( pRight->op==TK_COLUMN
   && !ExprHasProperty(pRight, EP_FixedCol)
   && sqlite3ExprIsConstant(pLeft)
   && sqlite3IsBinary(sqlite3BinaryCompareCollSeq(pConst->pParse,pLeft,pRight))
  ){
    constInsert(pConst, pRight, pLeft);
  }else
  if( pLeft->op==TK_COLUMN
   && !ExprHasProperty(pLeft, EP_FixedCol)
   && sqlite3ExprIsConstant(pRight)
   && sqlite3IsBinary(sqlite3BinaryCompareCollSeq(pConst->pParse,pLeft,pRight))
  ){
    constInsert(pConst, pLeft, pRight);
  }
}